

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::TransitionBLASState
          (DeviceContextVkImpl *this,BottomLevelASVkImpl *BLAS,RESOURCE_STATE OldState,
          RESOURCE_STATE NewState,bool UpdateInternalState)

{
  RESOURCE_STATE RVar1;
  VkAccessFlags srcAccessMask;
  VkAccessFlags dstAccessMask;
  VkPipelineStageFlags SrcStages;
  VkPipelineStageFlags DstStages;
  RESOURCE_STATE extraout_EDX;
  RESOURCE_STATE extraout_EDX_00;
  RESOURCE_STATE State;
  RESOURCE_STATE State_00;
  undefined7 in_register_00000081;
  char (*Args_2) [68];
  string msg;
  String local_70;
  String local_50;
  
  Args_2 = (char (*) [68])CONCAT71(in_register_00000081,UpdateInternalState);
  State = OldState;
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject !=
      (RenderPassVkImpl *)0x0) {
    FormatString<char[55]>
              (&msg,(char (*) [55])"State transitions are not allowed inside a render pass");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"TransitionBLASState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xc8e);
    State = extraout_EDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      State = extraout_EDX_00;
    }
  }
  RVar1 = (BLAS->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).m_State;
  if (OldState == RESOURCE_STATE_UNKNOWN) {
    OldState = RVar1;
    if (RVar1 == RESOURCE_STATE_UNKNOWN) {
      FormatString<char[41],char_const*,char[68]>
                (&msg,(Diligent *)"Failed to transition the state of BLAS \'",
                 (char (*) [41])
                 &(BLAS->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                  .m_Desc,(char **)
                          "\' because the BLAS state is unknown and is not explicitly specified",
                 Args_2);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p == &msg.field_2) {
        return;
      }
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      return;
    }
  }
  else if (RVar1 != OldState && RVar1 != RESOURCE_STATE_UNKNOWN) {
    GetResourceStateString_abi_cxx11_(&local_70,(Diligent *)(ulong)RVar1,State);
    GetResourceStateString_abi_cxx11_(&local_50,(Diligent *)(ulong)OldState,State_00);
    FormatString<char[11],std::__cxx11::string,char[11],char_const*,char[32],std::__cxx11::string,char[26]>
              (&msg,(Diligent *)"The state ",(char (*) [11])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6a7339,
               (char (*) [11])
               &(BLAS->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                .m_Desc,(char **)"\' does not match the old state ",(char (*) [32])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               " specified by the barrier",(char (*) [26])msg._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if ((~OldState & NewState) != RESOURCE_STATE_UNKNOWN ||
      (OldState &
      (RESOURCE_STATE_BUILD_AS_WRITE|RESOURCE_STATE_RESOLVE_DEST|RESOURCE_STATE_COPY_DEST|
       RESOURCE_STATE_UNORDERED_ACCESS|RESOURCE_STATE_RENDER_TARGET)) != RESOURCE_STATE_UNKNOWN) {
    EnsureVkCmdBuffer(this);
    srcAccessMask = AccelStructStateFlagsToVkAccessFlags(OldState);
    dstAccessMask = AccelStructStateFlagsToVkAccessFlags(NewState);
    SrcStages = ResourceStateFlagsToVkPipelineStageFlags(OldState);
    DstStages = ResourceStateFlagsToVkPipelineStageFlags(NewState);
    VulkanUtilities::VulkanCommandBuffer::MemoryBarrier
              (&this->m_CommandBuffer,srcAccessMask,dstAccessMask,SrcStages,DstStages);
    if (UpdateInternalState) {
      BottomLevelASBase<Diligent::EngineVkImplTraits>::SetState
                (&BLAS->super_BottomLevelASBase<Diligent::EngineVkImplTraits>,NewState);
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::TransitionBLASState(BottomLevelASVkImpl& BLAS,
                                              RESOURCE_STATE       OldState,
                                              RESOURCE_STATE       NewState,
                                              bool                 UpdateInternalState)
{
    VERIFY(m_pActiveRenderPass == nullptr, "State transitions are not allowed inside a render pass");
    if (OldState == RESOURCE_STATE_UNKNOWN)
    {
        if (BLAS.IsInKnownState())
        {
            OldState = BLAS.GetState();
        }
        else
        {
            LOG_ERROR_MESSAGE("Failed to transition the state of BLAS '", BLAS.GetDesc().Name, "' because the BLAS state is unknown and is not explicitly specified");
            return;
        }
    }
    else
    {
        if (BLAS.IsInKnownState() && BLAS.GetState() != OldState)
        {
            LOG_ERROR_MESSAGE("The state ", GetResourceStateString(BLAS.GetState()), " of BLAS '",
                              BLAS.GetDesc().Name, "' does not match the old state ", GetResourceStateString(OldState),
                              " specified by the barrier");
        }
    }

    // Always add barrier after writes.
    const bool AfterWrite = ResourceStateHasWriteAccess(OldState);

    if ((OldState & NewState) != NewState || AfterWrite)
    {
        EnsureVkCmdBuffer();
        VkAccessFlags        OldAccessFlags = AccelStructStateFlagsToVkAccessFlags(OldState);
        VkAccessFlags        NewAccessFlags = AccelStructStateFlagsToVkAccessFlags(NewState);
        VkPipelineStageFlags OldStages      = ResourceStateFlagsToVkPipelineStageFlags(OldState);
        VkPipelineStageFlags NewStages      = ResourceStateFlagsToVkPipelineStageFlags(NewState);
        m_CommandBuffer.MemoryBarrier(OldAccessFlags, NewAccessFlags, OldStages, NewStages);
        if (UpdateInternalState)
        {
            BLAS.SetState(NewState);
        }
    }
}